

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

size_t readmoredata(char *buffer,size_t size,size_t nitems,void *userp)

{
  long lVar1;
  size_t __n;
  long lVar2;
  undefined8 uVar3;
  size_t __n_00;
  
  lVar1 = *(long *)(*userp + 0x1e8);
  __n = *(size_t *)(lVar1 + 8);
  if (__n == 0) {
    __n_00 = 0;
  }
  else {
    __n_00 = nitems * size;
    *(bool *)(*userp + 0x1e3) = *(int *)(lVar1 + 0x78) == 1;
    if ((long)__n_00 < (long)__n) {
      memcpy(buffer,*(void **)(lVar1 + 0x10),__n_00);
      *(long *)(lVar1 + 0x10) = *(long *)(lVar1 + 0x10) + __n_00;
      *(long *)(lVar1 + 8) = *(long *)(lVar1 + 8) - __n_00;
    }
    else {
      memcpy(buffer,*(void **)(lVar1 + 0x10),__n);
      __n_00 = *(size_t *)(lVar1 + 8);
      if (*(long *)(lVar1 + 0x70) == 0) {
        *(undefined8 *)(lVar1 + 8) = 0;
      }
      else {
        *(undefined8 *)(lVar1 + 0x10) = *(undefined8 *)(lVar1 + 0x68);
        *(long *)(lVar1 + 8) = *(long *)(lVar1 + 0x70);
        lVar2 = *userp;
        uVar3 = *(undefined8 *)(lVar1 + 0x60);
        *(undefined8 *)(lVar2 + 0x4ef0) = *(undefined8 *)(lVar1 + 0x58);
        *(undefined8 *)(lVar2 + 0x4ef8) = uVar3;
        *(int *)(lVar1 + 0x78) = *(int *)(lVar1 + 0x78) + 1;
        *(undefined8 *)(lVar1 + 0x70) = 0;
      }
    }
  }
  return __n_00;
}

Assistant:

static size_t readmoredata(char *buffer,
                           size_t size,
                           size_t nitems,
                           void *userp)
{
  struct connectdata *conn = (struct connectdata *)userp;
  struct HTTP *http = conn->data->req.protop;
  size_t fullsize = size * nitems;

  if(!http->postsize)
    /* nothing to return */
    return 0;

  /* make sure that a HTTP request is never sent away chunked! */
  conn->data->req.forbidchunk = (http->sending == HTTPSEND_REQUEST)?TRUE:FALSE;

  if(http->postsize <= (curl_off_t)fullsize) {
    memcpy(buffer, http->postdata, (size_t)http->postsize);
    fullsize = (size_t)http->postsize;

    if(http->backup.postsize) {
      /* move backup data into focus and continue on that */
      http->postdata = http->backup.postdata;
      http->postsize = http->backup.postsize;
      conn->data->state.fread_func = http->backup.fread_func;
      conn->data->state.in = http->backup.fread_in;

      http->sending++; /* move one step up */

      http->backup.postsize=0;
    }
    else
      http->postsize = 0;

    return fullsize;
  }

  memcpy(buffer, http->postdata, fullsize);
  http->postdata += fullsize;
  http->postsize -= fullsize;

  return fullsize;
}